

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

shared_ptr<spdlog::logger> * lf::refinement::MeshHierarchy::Logger(void)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  if (Logger()::logger == '\0') {
    iVar1 = __cxa_guard_acquire(&Logger()::logger);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"lf::refinement::MeshHierarchy::Logger",&local_29);
      lf::base::InitLogger((base *)&Logger::logger,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(std::shared_ptr<spdlog::logger>::~shared_ptr,&Logger::logger,&__dso_handle);
      __cxa_guard_release(&Logger()::logger);
    }
  }
  return &Logger::logger;
}

Assistant:

std::shared_ptr<spdlog::logger> &MeshHierarchy::Logger() {
  static auto logger =
      base::InitLogger("lf::refinement::MeshHierarchy::Logger");
  return logger;
}